

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O3

void sylvan_serialize_tofile(FILE *out)

{
  uint8_t *puVar1;
  ulong uVar2;
  avl_node_t *paVar3;
  size_t sVar4;
  avl_iter_t *iter;
  sylvan_ser *psVar5;
  long lVar6;
  size_t __size;
  size_t sVar7;
  size_t sVar8;
  mtbddnode node;
  size_t local_48;
  ulong local_40;
  long local_38;
  
  sVar4 = avl_count(sylvan_ser_reversed_set);
  local_38 = sVar4 - sylvan_ser_done;
  if (sVar4 < sylvan_ser_done) {
    __assert_fail("count >= sylvan_ser_done",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                  ,0x8d5,"void sylvan_serialize_tofile(FILE *)");
  }
  if (sVar4 == sylvan_ser_counter - 1) {
    fwrite(&local_38,8,1,(FILE *)out);
    paVar3 = sylvan_ser_reversed_set;
    if (sylvan_ser_reversed_set == (avl_node_t *)0x0) {
      __size = 0x10;
    }
    else {
      __size = (ulong)(sylvan_ser_reversed_set->height + 1) * 8 + 8;
    }
    iter = (avl_iter_t *)malloc(__size);
    sVar4 = sylvan_ser_done;
    iter->height = 0;
    iter[1].height = (size_t)paVar3;
    sVar8 = 0;
    while ((sVar7 = sVar4, sVar4 != sVar8 &&
           (psVar5 = sylvan_ser_reversed_iter_next(iter), sVar7 = sVar8, psVar5 != (sylvan_ser *)0x0
           ))) {
      sVar8 = sVar8 + 1;
      if (sVar8 != psVar5->assigned) {
        __assert_fail("s->assigned == index",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                      ,0x8e1,"void sylvan_serialize_tofile(FILE *)");
      }
    }
    while( true ) {
      psVar5 = sylvan_ser_reversed_iter_next(iter);
      if (psVar5 == (sylvan_ser *)0x0) {
        sylvan_ser_done = sylvan_ser_counter - 1;
        free(iter);
        return;
      }
      if (sVar7 + 1 != psVar5->assigned) break;
      puVar1 = nodes->data;
      lVar6 = (psVar5->bdd & 0xffffffffff) * 0x10;
      uVar2 = *(ulong *)(puVar1 + lVar6 + 8);
      sVar4 = sylvan_serialize_get(uVar2 & 0xffffffffff);
      local_48 = sylvan_serialize_get(*(ulong *)(puVar1 + lVar6) & 0x800000ffffffffff);
      local_40 = sVar4 | uVar2 & 0xffffff0000000000;
      fwrite(&local_48,0x10,1,(FILE *)out);
      sVar7 = sVar7 + 1;
    }
    __assert_fail("s->assigned == index",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                  ,0x8e6,"void sylvan_serialize_tofile(FILE *)");
  }
  __assert_fail("count == sylvan_ser_counter-1",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                ,0x8d6,"void sylvan_serialize_tofile(FILE *)");
}

Assistant:

void
sylvan_serialize_tofile(FILE *out)
{
    size_t count = avl_count(sylvan_ser_reversed_set);
    assert(count >= sylvan_ser_done);
    assert(count == sylvan_ser_counter-1);
    count -= sylvan_ser_done;
    fwrite(&count, sizeof(size_t), 1, out);

    struct sylvan_ser *s;
    avl_iter_t *it = sylvan_ser_reversed_iter(sylvan_ser_reversed_set);

    /* Skip already written entries */
    size_t index = 0;
    while (index < sylvan_ser_done && (s=sylvan_ser_reversed_iter_next(it))) {
        index++;
        assert(s->assigned == index);
    }

    while ((s=sylvan_ser_reversed_iter_next(it))) {
        index++;
        assert(s->assigned == index);

        bddnode_t n = MTBDD_GETNODE(s->bdd);

        struct bddnode node;
        bddnode_makenode(&node, bddnode_getvariable(n), sylvan_serialize_get(bddnode_getlow(n)), sylvan_serialize_get(bddnode_gethigh(n)));

        fwrite(&node, sizeof(struct bddnode), 1, out);
    }

    sylvan_ser_done = sylvan_ser_counter-1;
    sylvan_ser_reversed_iter_free(it);
}